

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_subset.c
# Opt level: O1

_Bool array_container_is_subset_run(array_container_t *container1,run_container_t *container2)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  iVar5 = container1->cardinality;
  iVar3 = run_container_cardinality(container2);
  uVar4 = 0;
  if (iVar5 <= iVar3) {
    iVar5 = 0;
    for (; (iVar5 < container1->cardinality && ((int)uVar4 < container2->n_runs));
        uVar4 = uVar4 + (uVar6 < uVar2)) {
      uVar1 = container2->runs[(int)uVar4].value;
      uVar2 = container1->array[iVar5];
      if (uVar2 < uVar1) {
        uVar4 = 0;
        goto LAB_0011bfe2;
      }
      uVar6 = (uint)container2->runs[(int)uVar4].length + (uint)uVar1;
      iVar5 = (iVar5 + 1) - (uint)(uVar6 < uVar2);
    }
    uVar4 = (uint)(iVar5 == container1->cardinality);
  }
LAB_0011bfe2:
  return SUB41(uVar4,0);
}

Assistant:

bool array_container_is_subset_run(const array_container_t* container1,
                                   const run_container_t* container2) {
    if (container1->cardinality > run_container_cardinality(container2))
        return false;
    int i_array = 0, i_run = 0;
    while (i_array < container1->cardinality && i_run < container2->n_runs) {
        uint32_t start = container2->runs[i_run].value;
        uint32_t stop = start + container2->runs[i_run].length;
        if (container1->array[i_array] < start) {
            return false;
        } else if (container1->array[i_array] > stop) {
            i_run++;
        } else {  // the value of the array is in the run
            i_array++;
        }
    }
    if (i_array == container1->cardinality) {
        return true;
    } else {
        return false;
    }
}